

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

int lws_finalize_write_http_header(lws *wsi,uchar *start,uchar **pp,uchar *end)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int len;
  uchar *p;
  uchar *end_local;
  uchar **pp_local;
  uchar *start_local;
  lws *wsi_local;
  
  iVar1 = lws_finalize_http_header(wsi,pp,end);
  if (iVar1 == 0) {
    uVar2 = (int)*pp - (int)start;
    uVar3 = lws_write(wsi,start,(ulong)uVar2,LWS_WRITE_HTTP_HEADERS);
    if (uVar3 == uVar2) {
      wsi_local._4_4_ = 0;
    }
    else {
      wsi_local._4_4_ = 1;
    }
  }
  else {
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_finalize_write_http_header(struct lws *wsi, unsigned char *start,
			       unsigned char **pp, unsigned char *end)
{
	unsigned char *p;
	int len;

	if (lws_finalize_http_header(wsi, pp, end))
		return 1;

	p = *pp;
	len = lws_ptr_diff(p, start);

	if (lws_write(wsi, start, (unsigned int)len, LWS_WRITE_HTTP_HEADERS) != len)
		return 1;

	return 0;
}